

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAnalytic_mels.c
# Opt level: O3

int check_ans(N_Vector y,sunrealtype t,sunrealtype rtol,sunrealtype atol)

{
  double dVar1;
  
  dVar1 = atan(t);
  dVar1 = ABS(**(double **)((long)y->content + 0x10) - dVar1) * (1.0 / (ABS(dVar1) * 1e-06 + 1e-10))
  ;
  if (1.0 <= dVar1) {
    fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n",dVar1);
  }
  return (int)(1.0 <= dVar1);
}

Assistant:

static int check_ans(N_Vector y, sunrealtype t, sunrealtype rtol, sunrealtype atol)
{
  int passfail = 0;          /* answer pass (0) or fail (1) flag     */
  sunrealtype ans, err, ewt; /* answer data, error, and error weight */

  /* compute solution error */
  ans = atan(t);
  ewt = SUN_RCONST(1.0) / (rtol * fabs(ans) + atol);
  err = ewt * fabs(NV_Ith_S(y, 0) - ans);

  /* is the solution within the tolerances? */
  passfail = (err < SUN_RCONST(1.0)) ? 0 : 1;

  if (passfail)
  {
    fprintf(stdout, "\nSUNDIALS_WARNING: check_ans error=%" GSYM "\n\n", err);
  }

  return (passfail);
}